

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

void LossyDctEncoder_rleAc(LossyDctEncoder *e,uint16_t *block,uint16_t **acPtr)

{
  bool bVar1;
  int runLen;
  uint16_t *curAC;
  uint16_t rleSymbol;
  int dctComp;
  uint16_t **acPtr_local;
  uint16_t *block_local;
  LossyDctEncoder *e_local;
  
  dctComp = 1;
  curAC = *acPtr;
  while (dctComp < 0x40) {
    runLen = 1;
    if (block[dctComp] == 0) {
      while( true ) {
        bVar1 = false;
        if (dctComp + runLen < 0x40) {
          bVar1 = block[dctComp + runLen] == 0;
        }
        if (!bVar1) break;
        runLen = runLen + 1;
      }
      if (runLen == 1) {
        runLen = 1;
        *curAC = block[dctComp];
        e->_numAcComp = e->_numAcComp + 1;
      }
      else if (runLen + dctComp == 0x40) {
        *curAC = 0xff00;
        e->_numAcComp = e->_numAcComp + 1;
      }
      else {
        *curAC = (ushort)runLen | 0xff00;
        e->_numAcComp = e->_numAcComp + 1;
      }
      curAC = curAC + 1;
      dctComp = runLen + dctComp;
    }
    else {
      *curAC = block[dctComp];
      e->_numAcComp = e->_numAcComp + 1;
      dctComp = dctComp + 1;
      curAC = curAC + 1;
    }
  }
  *acPtr = curAC;
  return;
}

Assistant:

void
LossyDctEncoder_rleAc (LossyDctEncoder* e, uint16_t* block, uint16_t** acPtr)
{
    int       dctComp   = 1;
    uint16_t  rleSymbol = 0x0;
    uint16_t* curAC     = *acPtr;

    while (dctComp < 64)
    {
        int runLen = 1;

        //
        // If we don't have a 0, output verbatim
        //

        if (block[dctComp] != rleSymbol)
        {
            *curAC++ = block[dctComp];
            e->_numAcComp++;

            dctComp += runLen;
            continue;
        }

        //
        // We're sitting on a 0, so see how big the run is.
        //

        while ((dctComp + runLen < 64) &&
               (block[dctComp + runLen] == rleSymbol))
        {
            runLen++;
        }

        //
        // If the run len is too small, just output verbatim
        // otherwise output our run token
        //
        // Originally, we wouldn't have a separate symbol for
        // "end of block". But in some experimentation, it looks
        // like using 0xff00 for "end of block" can save a bit
        // of space.
        //

        if (runLen == 1)
        {
            runLen   = 1;
            *curAC++ = block[dctComp];
            e->_numAcComp++;

            //
            // Using 0xff00 for "end of block"
            //
        }
        else if (runLen + dctComp == 64)
        {
            //
            // Signal EOB
            //

            *curAC++ = 0xff00;
            e->_numAcComp++;
        }
        else
        {
            //
            // Signal normal run
            //

            *curAC++ = 0xff00 | runLen;
            e->_numAcComp++;
        }

        //
        // Advance by runLen
        //

        dctComp += runLen;
    }
    *acPtr = curAC;
}